

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::FlushLogFiles(int min_severity)

{
  int iVar1;
  LogDestination *this;
  ulong uVar2;
  long *plVar3;
  ulong uVar4;
  MutexLock local_30;
  MutexLock l;
  
  local_30.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar1 != 0) {
      abort();
    }
  }
  if (min_severity < 4) {
    uVar2 = (ulong)(uint)min_severity;
    plVar3 = &log_destinations_ + uVar2;
    uVar4 = 4;
    if (4 < (uint)min_severity) {
      uVar4 = (ulong)(uint)min_severity;
    }
    do {
      if (uVar4 == uVar2) {
        __assert_fail("severity >=0 && severity < NUM_SEVERITIES",
                      "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                      ,0x378,
                      "static LogDestination *google::LogDestination::log_destination(LogSeverity)")
        ;
      }
      this = (LogDestination *)*plVar3;
      if (this == (LogDestination *)0x0) {
        this = (LogDestination *)operator_new(0xe8);
        LogDestination(this,(LogSeverity)uVar2,(char *)0x0);
        *plVar3 = (long)this;
      }
      (*this->logger_->_vptr_Logger[3])();
      uVar2 = uVar2 + 1;
      plVar3 = plVar3 + 1;
    } while (uVar2 != 4);
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_30);
  return;
}

Assistant:

inline void LogDestination::FlushLogFiles(int min_severity) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  for (int i = min_severity; i < NUM_SEVERITIES; i++) {
    LogDestination* log = log_destination(i);
    if (log != NULL) {
      log->logger_->Flush();
    }
  }
}